

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::BenchmarkImp::Threads(BenchmarkImp *this,int t)

{
  int local_14;
  CheckHandler local_10;
  
  local_14 = t;
  if (0 < t) {
    GetNullLogInstance();
    std::vector<int,_std::allocator<int>_>::push_back(&this->thread_counts_,&local_14);
    return;
  }
  CheckHandler::CheckHandler
            (&local_10,"(t) > (0)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"Threads",0x1d9);
  CheckHandler::~CheckHandler(&local_10);
}

Assistant:

void BenchmarkImp::Threads(int t) {
  CHECK_GT(t, 0);
  thread_counts_.push_back(t);
}